

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp.c
# Opt level: O3

HTTP_CLIENT_RESULT uhttp_client_set_trusted_cert(HTTP_CLIENT_HANDLE handle,char *certificate)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  HTTP_CLIENT_RESULT HVar3;
  char *pcVar4;
  
  if (handle == (HTTP_CLIENT_HANDLE)0x0 || certificate == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return HTTP_CLIENT_INVALID_ARG;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c",
              "uhttp_client_set_trusted_cert",0x605,1,"invalid parameter handle: %p certificate: %p"
              ,handle,certificate);
    return HTTP_CLIENT_INVALID_ARG;
  }
  if ((handle->recv_msg).recv_state == state_initial) {
    iVar1 = mallocAndStrcpy_s(&handle->certificate,certificate);
    if (iVar1 == 0) {
      return HTTP_CLIENT_OK;
    }
    p_Var2 = xlogging_get_log_function();
    HVar3 = HTTP_CLIENT_ERROR;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return HTTP_CLIENT_ERROR;
    }
    pcVar4 = "failure allocating certificate";
    iVar1 = 0x611;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    HVar3 = HTTP_CLIENT_INVALID_STATE;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return HTTP_CLIENT_INVALID_STATE;
    }
    pcVar4 = "You must set the certificates before opening the connection";
    iVar1 = 0x60a;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c",
            "uhttp_client_set_trusted_cert",iVar1,1,pcVar4);
  return HVar3;
}

Assistant:

HTTP_CLIENT_RESULT uhttp_client_set_trusted_cert(HTTP_CLIENT_HANDLE handle, const char* certificate)
{
    HTTP_CLIENT_RESULT result;
    if (handle == NULL || certificate == NULL)
    {
        /* Codes_SRS_UHTTP_07_038: [If handle is NULL then http_client_set_trace shall return HTTP_CLIENT_INVALID_ARG] */
        result = HTTP_CLIENT_INVALID_ARG;
        LogError("invalid parameter handle: %p certificate: %p", handle, certificate);
    }
    else if (handle->recv_msg.recv_state != state_initial)
    {
        result = HTTP_CLIENT_INVALID_STATE;
        LogError("You must set the certificates before opening the connection");
    }
    else
    {
        if (mallocAndStrcpy_s(&handle->certificate, certificate) != 0)
        {
            result = HTTP_CLIENT_ERROR;
            LogError("failure allocating certificate");
        }
        else
        {
            result = HTTP_CLIENT_OK;
        }
    }
    return result;
}